

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_hrd(h264_hrd_parameters *hrd)

{
  uint local_14;
  int i;
  h264_hrd_parameters *hrd_local;
  
  printf("\t\t\tcpb_cnt_minus1 = %d\n",(ulong)hrd->cpb_cnt_minus1);
  printf("\t\t\tbit_rate_scale = %d\n",(ulong)hrd->bit_rate_scale);
  printf("\t\t\tcpb_size_scale = %d\n",(ulong)hrd->cpb_size_scale);
  for (local_14 = 0; local_14 <= hrd->cpb_cnt_minus1; local_14 = local_14 + 1) {
    printf("\t\t\tbit_rate_value_minus1[%d] = %d\n",(ulong)local_14,
           (ulong)hrd->bit_rate_value_minus1[(int)local_14]);
    printf("\t\t\tcpb_size_value_minus1[%d] = %d\n",(ulong)local_14,
           (ulong)hrd->cpb_size_value_minus1[(int)local_14]);
    printf("\t\t\tcbr_flag[%d] = %d\n",(ulong)local_14,(ulong)hrd->cbr_flag[(int)local_14]);
  }
  printf("\t\t\tinitial_cpb_removal_delay_length_minus1 = %d\n",
         (ulong)hrd->initial_cpb_removal_delay_length_minus1);
  printf("\t\t\tcpb_removal_delay_length_minus1 = %d\n",(ulong)hrd->cpb_removal_delay_length_minus1)
  ;
  printf("\t\t\tdpb_output_delay_length_minus1 = %d\n",(ulong)hrd->dpb_output_delay_length_minus1);
  printf("\t\t\ttime_offset_length = %d\n",(ulong)hrd->time_offset_length);
  return;
}

Assistant:

void h264_print_hrd(struct h264_hrd_parameters *hrd) {
	printf ("\t\t\tcpb_cnt_minus1 = %d\n", hrd->cpb_cnt_minus1);
	printf ("\t\t\tbit_rate_scale = %d\n", hrd->bit_rate_scale);
	printf ("\t\t\tcpb_size_scale = %d\n", hrd->cpb_size_scale);
	int i;
	for (i = 0; i <= hrd->cpb_cnt_minus1; i++) {
		printf ("\t\t\tbit_rate_value_minus1[%d] = %d\n", i, hrd->bit_rate_value_minus1[i]);
		printf ("\t\t\tcpb_size_value_minus1[%d] = %d\n", i, hrd->cpb_size_value_minus1[i]);
		printf ("\t\t\tcbr_flag[%d] = %d\n", i, hrd->cbr_flag[i]);
	}
	printf ("\t\t\tinitial_cpb_removal_delay_length_minus1 = %d\n", hrd->initial_cpb_removal_delay_length_minus1);
	printf ("\t\t\tcpb_removal_delay_length_minus1 = %d\n", hrd->cpb_removal_delay_length_minus1);
	printf ("\t\t\tdpb_output_delay_length_minus1 = %d\n", hrd->dpb_output_delay_length_minus1);
	printf ("\t\t\ttime_offset_length = %d\n", hrd->time_offset_length);
}